

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketsOps.cpp
# Opt level: O0

bool sznet::net::sockets::sz_sock_isselfconnect(sz_sock sockfd)

{
  bool local_5a;
  bool local_59;
  sockaddr_in *raddr4;
  sockaddr_in *laddr4;
  sockaddr_in6 peeraddr;
  sockaddr_in6 localaddr;
  sz_sock sockfd_local;
  
  sz_sock_getlocaladdr((sockaddr_in6 *)((long)&peeraddr.sin6_addr.__in6_u + 0xc),sockfd);
  sz_sock_getpeeraddr((sockaddr_in6 *)&laddr4,sockfd);
  if (peeraddr.sin6_addr.__in6_u.__u6_addr16[6] == 2) {
    local_59 = peeraddr.sin6_addr.__in6_u.__u6_addr16[7] == laddr4._2_2_ &&
               peeraddr.sin6_scope_id == laddr4._4_4_;
    localaddr.sin6_scope_id._3_1_ = local_59;
  }
  else if (peeraddr.sin6_addr.__in6_u.__u6_addr16[6] == 10) {
    local_5a = peeraddr.sin6_addr.__in6_u.__u6_addr16[7] == laddr4._2_2_ &&
               localaddr._0_16_ == peeraddr._0_16_;
    localaddr.sin6_scope_id._3_1_ = local_5a;
  }
  else {
    localaddr.sin6_scope_id._3_1_ = false;
  }
  return localaddr.sin6_scope_id._3_1_;
}

Assistant:

bool sz_sock_isselfconnect(sz_sock sockfd)
{
	struct sockaddr_in6 localaddr = sz_sock_getlocaladdr(sockfd);
	struct sockaddr_in6 peeraddr = sz_sock_getpeeraddr(sockfd);
	if (localaddr.sin6_family == AF_INET)
	{
		const struct sockaddr_in* laddr4 = reinterpret_cast<struct sockaddr_in*>(&localaddr);
		const struct sockaddr_in* raddr4 = reinterpret_cast<struct sockaddr_in*>(&peeraddr);
		return laddr4->sin_port == raddr4->sin_port
			&& laddr4->sin_addr.s_addr == raddr4->sin_addr.s_addr;
	}
	else if (localaddr.sin6_family == AF_INET6)
	{
		return localaddr.sin6_port == peeraddr.sin6_port
			&& memcmp(&localaddr.sin6_addr, &peeraddr.sin6_addr, sizeof(localaddr.sin6_addr)) == 0;
	}
	else
	{
		return false;
	}
}